

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# person_debt.cpp
# Opt level: O3

void debts::showDebt(Debt *rd)

{
  ostream *poVar1;
  
  pers::showPerson(&rd->name);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": $",3);
  poVar1 = std::ostream::_M_insert<double>(rd->amount);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void showDebt(const Debt & rd) {
        showPerson(rd.name);
        std::cout << ": $" << rd.amount << std::endl;
    }